

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fault.cc
# Opt level: O0

void __thiscall fault_parse_icc_cov_file_Test::TestBody(fault_parse_icc_cov_file_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  StatementType SVar3;
  Generator *pGVar4;
  Port *pPVar5;
  StmtBlock *this_01;
  element_type *peVar6;
  undefined4 extraout_var;
  char *pcVar7;
  Generator *top;
  char *in_R9;
  string local_3d0;
  AssertHelper local_3b0;
  Message local_3a8;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_;
  pair<kratos::Stmt_*const,_unsigned_int> *iter;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
  *__range1;
  Message local_360;
  int local_354;
  size_type local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar;
  string local_330;
  undefined1 local_310 [8];
  unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
  result;
  undefined1 local_2a8 [36];
  uint local_284;
  undefined1 local_280 [4];
  uint32_t i;
  shared_ptr<kratos::Stmt> local_270;
  shared_ptr<kratos::Stmt> local_260;
  undefined1 local_250 [8];
  shared_ptr<kratos::IfStmt> if_;
  undefined1 local_230 [8];
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  Port *local_1d0;
  Port *out;
  string local_1c0;
  __node_base local_1a0;
  Port *sel;
  string local_190;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context c;
  fault_parse_icc_cov_file_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar4 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pGVar4->debug = true;
  local_138 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"in",(allocator<char> *)((long)&sel + 7));
  kratos::Generator::port(pGVar4,In,&local_190,4);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sel + 7));
  pGVar4 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"sel",(allocator<char> *)((long)&out + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_1c0,4);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
  pGVar4 = local_138;
  local_1a0._M_nxt = (_Hash_node_base *)pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"out",&local_1f1);
  pPVar5 = kratos::Generator::port(pGVar4,Out,&local_1f0,4);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pGVar4 = local_138;
  local_1d0 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"KRATOS_INSTANCE_ID",
             (allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  kratos::Generator::parameter(pGVar4,&local_218,0x20);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::make_shared<kratos::CombinationalStmtBlock>();
  pGVar4 = local_138;
  this_00 = &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::CombinationalStmtBlock,void>
            ((shared_ptr<kratos::Stmt> *)this_00,
             (shared_ptr<kratos::CombinationalStmtBlock> *)local_230);
  kratos::Generator::add_stmt(pGVar4,(shared_ptr<kratos::Stmt> *)this_00);
  std::shared_ptr<kratos::Stmt>::~shared_ptr
            ((shared_ptr<kratos::Stmt> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_250);
  this_01 = &std::
             __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_230)->super_StmtBlock;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_260,(shared_ptr<kratos::IfStmt> *)local_250);
  kratos::StmtBlock::add_stmt(this_01,&local_260);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_260);
  peVar6 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_250);
  pPVar5 = local_1d0;
  kratos::constant(0,4,false);
  kratos::Var::assign((Var *)local_280,&pPVar5->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_270,(shared_ptr<kratos::AssignStmt> *)local_280);
  kratos::IfStmt::add_then_stmt(peVar6,&local_270);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_270);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_280);
  for (local_284 = 0; local_284 < 4; local_284 = local_284 + 1) {
    peVar6 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_250);
    iVar2 = (*(local_1d0->super_Var).super_IRNode._vptr_IRNode[9])(local_1d0,(ulong)local_284);
    kratos::constant(1,1,false);
    kratos::Var::assign((Var *)local_2a8,(Var *)CONCAT44(extraout_var,iVar2));
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
              ((shared_ptr<kratos::Stmt> *)(local_2a8 + 0x10),
               (shared_ptr<kratos::AssignStmt> *)local_2a8);
    kratos::IfStmt::add_else_stmt(peVar6,(shared_ptr<kratos::Stmt> *)(local_2a8 + 0x10));
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2a8 + 0x10));
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2a8);
  }
  kratos::fix_assignment_type(local_138);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&result._M_h._M_single_bucket,(kratos *)local_138,top);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&result._M_h._M_single_bucket);
  std::__cxx11::string::operator=((string *)&local_138->verilog_fn,"test.sv");
  pGVar4 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"icc_cov.txt",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  kratos::parse_icc_coverage
            ((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
              *)local_310,pGVar4,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_350 = std::
              unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
              ::size((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
                      *)local_310);
  local_354 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_348,"result.size()","2",&local_350,&local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_fault.cc"
               ,0xa9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  __end1 = std::
           unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
           ::begin((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
                    *)local_310);
  iter = (pair<kratos::Stmt_*const,_unsigned_int> *)
         std::
         unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
         ::end((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
                *)local_310);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<kratos::Stmt_*const,_unsigned_int>,_false>
                            ,(_Node_iterator_base<std::pair<kratos::Stmt_*const,_unsigned_int>,_false>
                              *)&iter), bVar1) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::__detail::_Node_iterator<std::pair<kratos::Stmt_*const,_unsigned_int>,_false,_false>
           ::operator*(&__end1);
    SVar3 = kratos::Stmt::type(*(Stmt **)gtest_ar_.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
    local_399 = SVar3 == Block;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_398,&local_399,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3d0,(internal *)local_398,
                 (AssertionResult *)"iter.first->type() == StatementType::Block","false","true",
                 in_R9);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_fault.cc"
                 ,0xab,pcVar7);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
    std::__detail::_Node_iterator<std::pair<kratos::Stmt_*const,_unsigned_int>,_false,_false>::
    operator++(&__end1);
  }
  std::
  unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
                    *)local_310);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_250);
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)local_230);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(fault, parse_icc_cov_file) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    mod.debug = true;
    mod.port(PortDirection::In, "in", 4);
    auto &sel = mod.port(PortDirection::In, "sel", 4);
    auto &out = mod.port(PortDirection::Out, "out", 4);
    mod.parameter("KRATOS_INSTANCE_ID", 32);

    auto comb = std::make_shared<CombinationalStmtBlock>();
    mod.add_stmt(comb);
    auto if_ = std::make_shared<IfStmt>(sel);
    comb->add_stmt(if_);
    if_->add_then_stmt(out.assign(constant(0, 4)));
    for (uint32_t i = 0; i < 4; i++) {
        if_->add_else_stmt(out[i].assign(constant(1, 1)));
    }

    fix_assignment_type(&mod);
    generate_verilog(&mod);
    // fake the output
    mod.verilog_fn = "test.sv";

    auto result = parse_icc_coverage(&mod, "icc_cov.txt");
    EXPECT_EQ(result.size(), 2);
    for (auto const &iter : result) {
        EXPECT_TRUE(iter.first->type() == StatementType::Block);
    }
}